

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall
Kernel::NonVariableIterator::NonVariableIterator
          (NonVariableIterator *this,Term *term,bool includeSelf)

{
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__NonVariableIterator_009ffb80;
  Lib::Stack<Kernel::Term_*>::Stack(&this->_stack,8);
  this->_added = 0;
  Lib::Stack<Kernel::Term_*>::push(&this->_stack,term);
  if (!includeSelf) {
    next(this);
  }
  return;
}

Assistant:

NonVariableIterator(Term* term,bool includeSelf=false)
  : _stack(8),
    _added(0)
  {
    _stack.push(term);
    if (!includeSelf) {
      NonVariableIterator::next();
    }
  }